

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorManager.cpp
# Opt level: O0

void __thiscall sf::priv::SensorManager::~SensorManager(SensorManager *this)

{
  int in_ESI;
  NonCopyable *in_RDI;
  SensorImpl *ctx;
  int i;
  int local_c;
  
  ctx = (SensorImpl *)in_RDI;
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    if (((byte)in_RDI[(long)local_c * 0x10] & 1) != 0) {
      ctx = (SensorImpl *)(in_RDI + (long)local_c * 0x10 + 2);
      SensorImpl::close(ctx,in_ESI);
    }
  }
  SensorImpl::cleanup((EVP_PKEY_CTX *)ctx);
  NonCopyable::~NonCopyable(in_RDI);
  return;
}

Assistant:

SensorManager::~SensorManager()
{
    // Per sensor cleanup
    for (int i = 0; i < Sensor::Count; ++i)
    {
        if (m_sensors[i].available)
            m_sensors[i].sensor.close();
    }

    // Global sensor cleanup
    SensorImpl::cleanup();
}